

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.hpp
# Opt level: O1

tuple<std::_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
 __thiscall
pstore::command_line::details::
parse_option_arguments<std::_List_iterator<std::__cxx11::string>,std::__cxx11::ostringstream>
          (details *this,
          _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          first_arg,
          _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          last_arg,string *program_name,
          basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *errs)

{
  details *pdVar1;
  bool bVar2;
  int iVar3;
  type *ptVar4;
  option **ppoVar5;
  ostream *poVar6;
  string *psVar7;
  _List_node_base *extraout_RDX;
  _Head_base<0UL,_std::_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  _Var8;
  _List_node_base *extraout_RDX_00;
  _List_node_base *extraout_RDX_01;
  _List_node_base *extraout_RDX_02;
  _List_node_base *extraout_RDX_03;
  _List_node_base *extraout_RDX_04;
  _List_node_base *extraout_RDX_05;
  _List_node_base *extraout_RDX_06;
  _List_node_base *extraout_RDX_07;
  _List_node_base *extraout_RDX_08;
  _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extraout_RDX_09;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  byte bVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  bool bVar13;
  details dVar14;
  tuple<std::_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  tVar15;
  maybe<pstore::command_line::option_*,_void> handler;
  string arg_name;
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void> value
  ;
  maybe<pstore::command_line::option_*,_void> local_158;
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  *local_148;
  string *local_140;
  details local_138 [8];
  option *local_130;
  maybe<pstore::command_line::option_*,_void> local_128;
  maybe<pstore::command_line::option_*,_void> local_118;
  string local_108;
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  local_e8;
  undefined1 local_c0 [8];
  type local_b8;
  long *local_98 [2];
  long local_88 [2];
  long *local_78 [2];
  long local_68 [2];
  string local_58;
  details *local_38;
  
  local_e8.storage_._8_8_ = 0;
  local_e8.storage_._16_8_ = 0;
  local_e8._0_8_ = 0;
  local_e8.storage_.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_e8.storage_._24_8_ = 0;
  local_158._0_8_ = 0;
  local_158.storage_ = (type)0x0;
  local_148 = (maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
               *)program_name;
  local_140 = (string *)errs;
  local_38 = this;
  if (first_arg._M_node == last_arg._M_node) {
    uVar12 = 1;
    _Var8._M_head_impl._M_node =
         (_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )(_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )last_arg._M_node;
  }
  else {
    uVar12 = 1;
    do {
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_108,first_arg._M_node[1]._M_next,
                 (long)&(first_arg._M_node[1]._M_prev)->_M_next + (long)first_arg._M_node[1]._M_next
                );
      local_118.valid_ = false;
      bVar13 = local_158.valid_ == true;
      if (bVar13) {
        ptVar4 = (type *)maybe<pstore::command_line::option_*,_void>::operator->(&local_158);
        local_118.storage_ = *ptVar4;
      }
      local_118.valid_ = bVar13;
      bVar13 = handler_takes_argument(&local_118);
      if (local_118.valid_ == true) {
        local_118.valid_ = false;
      }
      if (bVar13) {
        local_128.valid_ = false;
        bVar13 = local_158.valid_ == true;
        if (bVar13) {
          ptVar4 = (type *)maybe<pstore::command_line::option_*,_void>::operator->(&local_158);
          local_128.storage_ = *ptVar4;
        }
        local_128.valid_ = bVar13;
        bVar13 = handler_set_value(&local_128,&local_108);
        uVar11 = uVar12 & 0xff;
        if ((uVar12 & 1) != 0) {
          uVar11 = (uint)bVar13;
        }
        if (local_128.valid_ == true) {
          local_128.valid_ = false;
        }
        _Var8._M_head_impl._M_node =
             (_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )extraout_RDX;
        if (local_158.valid_ == true) {
          local_158._0_8_ = local_158._0_8_ & 0xffffffffffffff00;
        }
        goto LAB_0012d649;
      }
      iVar3 = std::__cxx11::string::compare((char *)&local_108);
      if (iVar3 == 0) {
        first_arg._M_node = (first_arg._M_node)->_M_next;
        bVar13 = true;
        _Var8._M_head_impl._M_node =
             (_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )extraout_RDX_00;
      }
      else {
        bVar2 = argument_is_positional(&local_108);
        bVar13 = true;
        _Var8._M_head_impl._M_node =
             (_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )extraout_RDX_01;
        if (!bVar2) {
          bVar13 = starts_with(&local_108,"--");
          if (bVar13) {
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_58,local_108._M_dataplus._M_p,
                       local_108._M_dataplus._M_p + local_108._M_string_length);
            get_option_and_value
                      ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                        *)local_c0,&local_58);
            std::__cxx11::string::operator=((string *)&local_108,(string *)local_98);
            maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
            ::operator=(&local_e8,
                        (maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                         *)local_c0);
            if (local_98[0] != local_88) {
              operator_delete(local_98[0],local_88[0] + 1);
            }
            if (local_c0[0] == true) {
              local_c0._0_4_ = local_c0._0_4_ & 0xffffff00;
              if ((undefined1 *)CONCAT71(local_b8._1_7_,local_b8.__data[0]) != local_c0 + 0x18) {
                operator_delete((undefined1 *)CONCAT71(local_b8._1_7_,local_b8.__data[0]),
                                local_b8._16_8_ + 1);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            }
            find_handler((maybe<pstore::command_line::option_*,_void> *)local_c0,&local_108);
            maybe<pstore::command_line::option_*,_void>::operator=
                      (&local_158,(maybe<pstore::command_line::option_*,_void> *)local_c0);
            if (local_c0[0] == true) {
              local_c0._0_4_ = local_c0._0_4_ & 0xffffff00;
            }
            if (local_158.valid_ == true) {
              ppoVar5 = maybe<pstore::command_line::option_*,_void>::operator->(&local_158);
              iVar3 = (*(*ppoVar5)->_vptr_option[9])();
              if ((char)iVar3 == '\0') {
                local_138[0] = (details)0x0;
                dVar14 = (details)(local_158.valid_ == true);
                if ((bool)dVar14) {
                  ppoVar5 = maybe<pstore::command_line::option_*,_void>::operator->(&local_158);
                  local_130 = *ppoVar5;
                }
                errs = (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_140;
                local_138[0] = dVar14;
                record_value_if_available<std::__cxx11::ostringstream>
                          ((tuple<pstore::maybe<pstore::command_line::option_*,_void>,_bool> *)
                           local_c0,local_138,
                           (maybe<pstore::command_line::option_*,_void> *)&local_e8,local_148,
                           local_140,in_R9);
                maybe<pstore::command_line::option_*,_void>::operator=
                          (&local_158,(maybe<pstore::command_line::option_*,_void> *)(local_c0 + 8))
                ;
                uVar11 = local_c0._0_4_;
                if ((uVar12 & 1) == 0) {
                  uVar11 = uVar12 & 0xff;
                }
                if ((bool)local_b8.__data[0] == true) {
                  local_b8.__data[0] = false;
                }
                _Var8._M_head_impl._M_node =
                     (_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )extraout_RDX_06;
                if (local_138[0] == (details)0x1) {
                  local_138[0] = (details)0x0;
                }
                goto LAB_0012d649;
              }
            }
            report_unknown_option<std::__cxx11::ostringstream>
                      ((string *)local_148,&local_108,&local_e8,
                       (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_140);
            bVar13 = false;
            uVar11 = uVar12 & 1;
            _Var8._M_head_impl._M_node =
                 (_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )extraout_RDX_02;
            uVar12 = uVar12 & 0xff;
            if (uVar11 != 0) {
              uVar12 = 0;
            }
          }
          else {
            local_78[0] = local_68;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_78,local_108._M_dataplus._M_p,
                       local_108._M_dataplus._M_p + local_108._M_string_length);
            process_single_dash<std::__cxx11::ostringstream>
                      ((tuple<pstore::maybe<pstore::command_line::option_*,_void>,_bool> *)local_c0,
                       (details *)local_78,(string *)local_148,local_140,errs);
            maybe<pstore::command_line::option_*,_void>::operator=
                      (&local_158,(maybe<pstore::command_line::option_*,_void> *)(local_c0 + 8));
            uVar11 = local_c0._0_4_;
            if ((uVar12 & 1) == 0) {
              uVar11 = uVar12 & 0xff;
            }
            if ((bool)local_b8.__data[0] == true) {
              local_b8.__data[0] = false;
            }
            _Var8._M_head_impl._M_node =
                 (_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )extraout_RDX_04;
            if (local_78[0] != local_68) {
              operator_delete(local_78[0],local_68[0] + 1);
              _Var8._M_head_impl._M_node =
                   (_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )extraout_RDX_05;
            }
LAB_0012d649:
            bVar13 = false;
            uVar12 = uVar11;
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        _Var8._M_head_impl._M_node =
             (_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )extraout_RDX_03;
      }
    } while ((!bVar13) &&
            (first_arg._M_node = (first_arg._M_node)->_M_next, first_arg._M_node != last_arg._M_node
            ));
  }
  bVar9 = (byte)uVar12;
  bVar10 = bVar9;
  if (local_158.valid_ == true) {
    ppoVar5 = maybe<pstore::command_line::option_*,_void>::operator->(&local_158);
    iVar3 = (*(*ppoVar5)->_vptr_option[0xe])();
    _Var8._M_head_impl._M_node =
         (_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )(_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )extraout_RDX_07;
    if ((char)iVar3 != '\0') {
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_140,*(char **)local_148,
                          (long)(local_148->storage_).__align);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,": Argument \'",0xc);
      ppoVar5 = maybe<pstore::command_line::option_*,_void>::operator->(&local_158);
      psVar7 = option::name_abi_cxx11_(*ppoVar5);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(psVar7->_M_dataplus)._M_p,psVar7->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\' requires a value\n",0x13);
      _Var8._M_head_impl._M_node =
           (_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )(_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )extraout_RDX_08;
      bVar10 = 0;
      if ((uVar12 & 1) == 0) {
        bVar10 = bVar9;
      }
    }
  }
  pdVar1 = local_38;
  *local_38 = (details)(bVar10 & 1);
  *(_List_node_base **)(local_38 + 8) = first_arg._M_node;
  if (local_158.valid_ == true) {
    local_158._0_8_ = local_158._0_8_ & 0xffffffffffffff00;
  }
  if ((local_e8.valid_ == true) &&
     (local_e8._0_8_ = local_e8._0_8_ & 0xffffffffffffff00,
     local_e8.storage_.__align !=
     (anon_struct_8_0_00000001_for___align)((long)&local_e8.storage_ + 0x10))) {
    operator_delete((void *)local_e8.storage_.__align,local_e8.storage_._16_8_ + 1);
    _Var8._M_head_impl._M_node =
         (_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )(_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )extraout_RDX_09._M_node;
  }
  tVar15.
  super__Tuple_impl<0UL,_std::_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  .
  super__Head_base<0UL,_std::_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  ._M_head_impl._M_node = _Var8._M_head_impl._M_node;
  tVar15.
  super__Tuple_impl<0UL,_std::_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  ._0_8_ = pdVar1;
  return (tuple<std::_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
          )tVar15.
           super__Tuple_impl<0UL,_std::_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  ;
}

Assistant:

std::tuple<InputIterator, bool>
            parse_option_arguments (InputIterator first_arg, InputIterator last_arg,
                                    std::string const & program_name, ErrorStream & errs) {
                using str = stream_trait<typename ErrorStream::char_type>;
                auto value = nothing<std::string> ();
                auto handler = nothing<option *> ();
                sticky_bool<false> ok{true};

                for (; first_arg != last_arg; ++first_arg) {
                    std::string arg_name = *first_arg;
                    // Is this the argument for the preceeding switch?
                    if (handler_takes_argument (handler)) {
                        ok = handler_set_value (handler, arg_name);
                        handler.reset ();
                        continue;
                    }

                    // A double-dash argument on its own indicates that the following are
                    // positional arguments.
                    if (arg_name == "--") {
                        ++first_arg; // swallow this argument.
                        break;
                    }
                    // If this argument has no leading dash, this and the following are
                    // positional arguments.
                    if (argument_is_positional (arg_name)) {
                        break;
                    }

                    if (starts_with (arg_name, "--")) {
                        std::tie (arg_name, value) = get_option_and_value (arg_name);

                        handler = find_handler (arg_name);
                        if (!handler || (*handler)->is_positional ()) {
                            report_unknown_option (program_name, arg_name, value, errs);
                            ok = false;
                            continue;
                        }

                        std::tie (handler, ok) =
                            record_value_if_available (handler, value, program_name, errs);
                    } else {
                        std::tie (handler, ok) = process_single_dash (arg_name, program_name, errs);
                    }
                }

                if (handler && (*handler)->takes_argument ()) {
                    errs << str::out_string (program_name) << str::out_text (": Argument '")
                         << str::out_string ((*handler)->name ())
                         << str::out_text ("' requires a value\n");
                    ok = false;
                }
                return std::make_tuple (first_arg, static_cast<bool> (ok));
            }